

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBinaryUriComponent
          (EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
          ArrayPtr<const_char> text,DecodeUriOptions options)

{
  size_t sVar1;
  NullableValue<unsigned_int> NVar2;
  NullableValue<unsigned_int> *pNVar3;
  uint *puVar4;
  Array<unsigned_char> local_c8;
  int local_b0;
  char local_a9;
  uint *local_a8;
  uint *d2;
  NullableValue<unsigned_int> local_94;
  NullableValue<unsigned_int> _d2518;
  byte b;
  uint *d1;
  NullableValue<unsigned_int> local_78;
  NullableValue<unsigned_int> _d1513;
  char *end;
  NullableValue<unsigned_int> local_58;
  char *ptr;
  undefined1 local_48 [7];
  bool hadErrors;
  Vector<unsigned_char> result;
  undefined1 auStack_20 [6];
  DecodeUriOptions options_local;
  ArrayPtr<const_char> text_local;
  
  result.builder.disposer._6_2_ = (ushort)text.size_;
  _auStack_20 = this;
  sVar1 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)auStack_20);
  Vector<unsigned_char>::Vector
            ((Vector<unsigned_char> *)local_48,sVar1 + (result.builder.disposer._6_1_ & 1));
  ptr._7_1_ = false;
  local_58 = (NullableValue<unsigned_int>)
             ArrayPtr<const_char>::begin((ArrayPtr<const_char> *)auStack_20);
  _d1513 = (NullableValue<unsigned_int>)
           ArrayPtr<const_char>::end((ArrayPtr<const_char> *)auStack_20);
  while ((ulong)local_58 < (ulong)_d1513) {
    if (*(char *)local_58 == '%') {
      NVar2 = (NullableValue<unsigned_int>)((long)local_58 + 1);
      if (NVar2 == _d1513) {
        ptr._7_1_ = true;
        local_58 = NVar2;
      }
      else {
        anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&d1,*(char *)NVar2);
        pNVar3 = _::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&d1);
        _::NullableValue<unsigned_int>::NullableValue(&local_78,pNVar3);
        Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&d1);
        puVar4 = _::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_78);
        if (puVar4 == (uint *)0x0) {
          ptr._7_1_ = true;
          local_58 = NVar2;
        }
        else {
          register0x00000000 = _::NullableValue<unsigned_int>::operator*(&local_78);
          _d2518._3_1_ = SUB41(*register0x00000000,0);
          NVar2 = (NullableValue<unsigned_int>)((long)local_58 + 2);
          if (NVar2 == _d1513) {
            ptr._7_1_ = true;
            local_58 = NVar2;
          }
          else {
            anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)((long)&d2 + 4),*(char *)NVar2);
            pNVar3 = _::readMaybe<unsigned_int>((Maybe<unsigned_int> *)((long)&d2 + 4));
            _::NullableValue<unsigned_int>::NullableValue(&local_94,pNVar3);
            Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)((long)&d2 + 4));
            puVar4 = _::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_94);
            if (puVar4 == (uint *)0x0) {
              ptr._7_1_ = true;
              local_58 = NVar2;
            }
            else {
              local_a8 = _::NullableValue<unsigned_int>::operator*(&local_94);
              _d2518._3_1_ = _d2518._3_1_ << 4 | (byte)*local_a8;
              local_58 = (NullableValue<unsigned_int>)((long)local_58 + 3);
            }
            _::NullableValue<unsigned_int>::~NullableValue(&local_94);
          }
          Vector<unsigned_char>::add<unsigned_char&>
                    ((Vector<unsigned_char> *)local_48,&_d2518.field_0x3);
        }
        _::NullableValue<unsigned_int>::~NullableValue(&local_78);
      }
    }
    else {
      if (((result.builder.disposer._6_2_ & 0x100) == 0) || (*(char *)local_58 != '+')) {
        Vector<unsigned_char>::add<char_const&>((Vector<unsigned_char> *)local_48,(char *)local_58);
      }
      else {
        local_a9 = ' ';
        Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)local_48,&local_a9);
      }
      local_58 = (NullableValue<unsigned_int>)((long)local_58 + 1);
    }
  }
  if ((result.builder.disposer._6_2_ & 1) != 0) {
    local_b0 = 0;
    Vector<unsigned_char>::add<int>((Vector<unsigned_char> *)local_48,&local_b0);
  }
  Vector<unsigned_char>::releaseAsArray(&local_c8,(Vector<unsigned_char> *)local_48);
  EncodingResult<kj::Array<unsigned_char>_>::EncodingResult
            (__return_storage_ptr__,&local_c8,ptr._7_1_);
  Array<unsigned_char>::~Array(&local_c8);
  Vector<unsigned_char>::~Vector((Vector<unsigned_char> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<byte>> decodeBinaryUriComponent(
    ArrayPtr<const char> text, DecodeUriOptions options) {
  Vector<byte> result(text.size() + options.nulTerminate);
  bool hadErrors = false;

  const char* ptr = text.begin();
  const char* end = text.end();
  while (ptr < end) {
    if (*ptr == '%') {
      ++ptr;

      if (ptr == end) {
        hadErrors = true;
      } else KJ_IF_SOME(d1, tryFromHexDigit(*ptr)) {
        byte b = d1;
        ++ptr;
        if (ptr == end) {
          hadErrors = true;
        } else KJ_IF_SOME(d2, tryFromHexDigit(*ptr)) {
          b = (b << 4) | d2;
          ++ptr;
        } else {
          hadErrors = true;
        }
        result.add(b);
      } else {
        hadErrors = true;
      }
    } else if (options.plusToSpace && *ptr == '+') {
      ++ptr;
      result.add(' ');
    } else {
      result.add(*ptr++);
    }
  }